

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O1

void mpiabi_probe_(MPIABI_Fint *source,MPIABI_Fint *tag,MPIABI_Fint *comm,MPIABI_Fint *status,
                  MPIABI_Fint *ierror)

{
  mpi_probe_();
  return;
}

Assistant:

void mpiabi_probe_(
  const MPIABI_Fint * source,
  const MPIABI_Fint * tag,
  const MPIABI_Fint * comm,
  MPIABI_Fint * status,
  MPIABI_Fint * ierror
) {
  return mpi_probe_(
    source,
    tag,
    comm,
    status,
    ierror
  );
}